

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O2

wstring * __thiscall
mjs::cpp_quote_abi_cxx11_(wstring *__return_storage_ptr__,mjs *this,wstring_view *s)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  wchar_t wVar4;
  uint uVar5;
  long lVar6;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = L'\0';
  lVar2 = *(long *)this;
  lVar3 = *(long *)(this + 8);
  lVar6 = 0;
  do {
    if (lVar2 << 2 == lVar6) {
      return __return_storage_ptr__;
    }
    uVar1 = *(uint *)(lVar3 + lVar6);
    wVar4 = (wchar_t)__return_storage_ptr__;
    if (((uVar1 - 0x80 < 0xffffffa0) || (uVar1 == 0x5c)) || (uVar1 == 0x22)) {
      uVar5 = uVar1 & 0xffff;
      switch(uVar5) {
      case 8:
        break;
      case 9:
        break;
      case 10:
        break;
      case 0xb:
switchD_0015dd8d_caseD_b:
        std::__cxx11::wstring::push_back(wVar4);
        if ((ushort)uVar1 < 0x100) {
          std::__cxx11::wstring::push_back(wVar4);
        }
        else {
          std::__cxx11::wstring::push_back(wVar4);
          std::__cxx11::wstring::push_back(wVar4);
          std::__cxx11::wstring::push_back(wVar4);
        }
        std::__cxx11::wstring::push_back(wVar4);
        goto LAB_0015de80;
      case 0xc:
        break;
      case 0xd:
        break;
      default:
        if (((uVar5 != 0x5c) && (uVar5 != 0x27)) && (uVar5 != 0x22)) goto switchD_0015dd8d_caseD_b;
      }
      std::__cxx11::wstring::append((wchar_t *)__return_storage_ptr__);
    }
    else {
LAB_0015de80:
      std::__cxx11::wstring::push_back(wVar4);
    }
    lVar6 = lVar6 + 4;
  } while( true );
}

Assistant:

std::wstring cpp_quote(const std::wstring_view& s) {
    std::wstring r;
    for (const auto c: s) {
        if (c < 32 || c > 127 || c == '\"' || c == '\\') {
            cpp_quote_escape(r, c);
        } else {
            r += c;
        }
    }
    return r;
}